

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O1

agent_pending_query *
agent_query(strbuf *query,void **out,int *outlen,_func_void_void_ptr_void_ptr_int *callback,
           void *callback_ctx)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  size_t sVar5;
  ssize_t sVar6;
  agent_pending_query *paVar7;
  int *piVar8;
  int *extraout_RAX;
  int *piVar9;
  ulong uVar10;
  sockaddr_un addr;
  sockaddr local_9e [6];
  
  __s = getenv("SSH_AUTH_SOCK");
  if ((__s == (char *)0x0) || (sVar5 = strlen(__s), 0x6b < sVar5)) {
LAB_0011a65c:
    *out = (void *)0x0;
    *outlen = 0;
    return (agent_pending_query *)0x0;
  }
  piVar9 = (int *)0x1;
  iVar2 = socket(1,1,0);
  if (-1 < iVar2) {
    cloexec(iVar2);
    local_9e[0].sa_family = 1;
    strcpy(local_9e[0].sa_data,__s);
    iVar3 = connect(iVar2,local_9e,0x6e);
    if (iVar3 < 0) {
      close(iVar2);
    }
    else {
      strbuf_finalise_agent_query(query);
      uVar10 = 0;
      while( true ) {
        sVar5 = query->len - uVar10;
        if (query->len < uVar10 || sVar5 == 0) {
          paVar7 = (agent_pending_query *)safemalloc(1,0x30,0);
          paVar7->fd = iVar2;
          paVar7->retbuf = paVar7->sizebuf;
          paVar7->retsize = 4;
          paVar7->retlen = 0;
          paVar7->callback = callback;
          paVar7->callback_ctx = callback_ctx;
          if (callback == (_func_void_void_ptr_void_ptr_int *)0x0) {
            no_nonblock(iVar2);
            do {
              _Var1 = agent_try_read(paVar7);
            } while (!_Var1);
            *out = paVar7->retbuf;
            *outlen = paVar7->retlen;
            safefree(paVar7);
            return (agent_pending_query *)0x0;
          }
          if (agent_pending_queries == (tree234 *)0x0) {
            agent_pending_queries = newtree234(agent_conncmp);
          }
          add234(agent_pending_queries,paVar7);
          uxsel_set(iVar2,1,agent_select_result);
          return paVar7;
        }
        sVar6 = write(iVar2,query->s + uVar10,sVar5);
        if ((int)sVar6 < 1) break;
        uVar10 = (ulong)(uint)((int)uVar10 + (int)sVar6);
      }
      close(iVar2);
    }
    goto LAB_0011a65c;
  }
  agent_query_cold_1();
  sVar6 = read(*piVar9,(void *)(*(long *)(piVar9 + 2) + (long)piVar9[6]),
               (long)piVar9[5] - (long)piVar9[6]);
  if ((int)sVar6 < 1) {
    piVar8 = piVar9 + 4;
    if (*(int **)(piVar9 + 2) != piVar8) {
      safefree(*(int **)(piVar9 + 2));
      piVar8 = extraout_RAX;
    }
LAB_0011a7b5:
    piVar9[2] = 0;
    piVar9[3] = 0;
    piVar9[6] = 0;
    paVar7 = (agent_pending_query *)CONCAT71((int7)((ulong)piVar8 >> 8),1);
  }
  else {
    iVar2 = (int)sVar6 + piVar9[6];
    piVar9[6] = iVar2;
    if ((piVar9[5] == 4) && (iVar2 == 4)) {
      uVar4 = **(uint **)(piVar9 + 2);
      uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) + 4;
      piVar8 = (int *)(ulong)uVar4;
      piVar9[5] = uVar4;
      if ((int)uVar4 < 1) goto LAB_0011a7b5;
      if (*(uint **)(piVar9 + 2) != (uint *)(piVar9 + 4)) {
        __assert_fail("conn->retbuf == conn->sizebuf",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                      ,0x52,"_Bool agent_try_read(agent_pending_query *)");
      }
      piVar8 = (int *)safemalloc((ulong)uVar4,1,0);
      *(int **)(piVar9 + 2) = piVar8;
      *piVar8 = piVar9[4];
    }
    paVar7 = (agent_pending_query *)
             (ulong)CONCAT31((int3)((uint)piVar9[6] >> 8),piVar9[5] <= piVar9[6]);
  }
  return paVar7;
}

Assistant:

agent_pending_query *agent_query(
    strbuf *query, void **out, int *outlen,
    void (*callback)(void *, void *, int), void *callback_ctx)
{
    const char *name;
    int sock;
    struct sockaddr_un addr;
    int done;
    agent_pending_query *conn;

    name = agent_socket_path();
    if (!name || strlen(name) >= sizeof(addr.sun_path))
        goto failure;

    sock = socket(PF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        perror("socket(PF_UNIX)");
        exit(1);
    }

    cloexec(sock);

    addr.sun_family = AF_UNIX;
    strcpy(addr.sun_path, name);
    if (connect(sock, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        close(sock);
        goto failure;
    }

    strbuf_finalise_agent_query(query);

    for (done = 0; done < query->len ;) {
        int ret = write(sock, query->s + done,
                        query->len - done);
        if (ret <= 0) {
            close(sock);
            goto failure;
        }
        done += ret;
    }

    conn = snew(agent_pending_query);
    conn->fd = sock;
    conn->retbuf = conn->sizebuf;
    conn->retsize = 4;
    conn->retlen = 0;
    conn->callback = callback;
    conn->callback_ctx = callback_ctx;

    if (!callback) {
        /*
         * Bodge to permit making deliberately synchronous agent
         * requests. Used by Unix Pageant in command-line client mode,
         * which is legit because it really is true that no other part
         * of the program is trying to get anything useful done
         * simultaneously. But this special case shouldn't be used in
         * any more general program.
         */
        no_nonblock(conn->fd);
        while (!agent_try_read(conn))
            /* empty loop body */;

        *out = conn->retbuf;
        *outlen = conn->retlen;
        sfree(conn);
        return NULL;
    }

    /*
     * Otherwise do it properly: add conn to the tree of agent
     * connections currently in flight, return 0 to indicate that the
     * response hasn't been received yet, and call the callback when
     * select_result comes back to us.
     */
    if (!agent_pending_queries)
        agent_pending_queries = newtree234(agent_conncmp);
    add234(agent_pending_queries, conn);

    uxsel_set(sock, SELECT_R, agent_select_result);
    return conn;

    failure:
    *out = NULL;
    *outlen = 0;
    return NULL;
}